

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_x86.cpp
# Opt level: O3

int __thiscall ncnn::Cast_x86::forward(Cast_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  int _elempack;
  int iVar4;
  int *piVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  undefined1 auVar9 [12];
  unsigned_short uVar10;
  int iVar11;
  _func_int **pp_Var12;
  void *pvVar13;
  _func_int *p_Var14;
  uint uVar15;
  uint uVar16;
  long lVar17;
  void *pvVar18;
  undefined8 *puVar19;
  undefined1 (*pauVar20) [16];
  ulong uVar21;
  undefined4 *puVar22;
  int iVar23;
  size_t sVar24;
  ulong uVar25;
  long lVar26;
  float fVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  
  p_Var14 = this->_vptr_Cast_x86[-3];
  if (*(int *)(&this->field_0xd0 + (long)p_Var14) == *(int *)(&this->field_0xd4 + (long)p_Var14)) {
    if (top_blob == bottom_blob) {
      return 0;
    }
    piVar5 = bottom_blob->refcount;
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + 1;
      UNLOCK();
    }
    piVar5 = top_blob->refcount;
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + -1;
      UNLOCK();
      if (*piVar5 == 0) {
        if (top_blob->allocator == (Allocator *)0x0) {
          if (top_blob->data != (void *)0x0) {
            free(top_blob->data);
          }
        }
        else {
          (*top_blob->allocator->_vptr_Allocator[3])();
        }
      }
    }
    top_blob->cstep = 0;
    top_blob->data = (void *)0x0;
    top_blob->refcount = (int *)0x0;
    *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
    *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
    top_blob->dims = 0;
    top_blob->w = 0;
    top_blob->h = 0;
    top_blob->d = 0;
    top_blob->c = 0;
    piVar5 = bottom_blob->refcount;
    top_blob->data = bottom_blob->data;
    top_blob->refcount = piVar5;
    top_blob->elemsize = bottom_blob->elemsize;
    top_blob->elempack = bottom_blob->elempack;
    top_blob->allocator = bottom_blob->allocator;
    iVar2 = bottom_blob->w;
    iVar23 = bottom_blob->h;
    iVar3 = bottom_blob->d;
    top_blob->dims = bottom_blob->dims;
    top_blob->w = iVar2;
    top_blob->h = iVar23;
    top_blob->d = iVar3;
    top_blob->c = bottom_blob->c;
    top_blob->cstep = bottom_blob->cstep;
    return 0;
  }
  iVar2 = bottom_blob->w;
  iVar23 = bottom_blob->h;
  iVar3 = bottom_blob->d;
  uVar15 = bottom_blob->c;
  iVar11 = bottom_blob->dims;
  _elempack = bottom_blob->elempack;
  sVar24 = (size_t)_elempack;
  switch(*(int *)(&this->field_0xd4 + (long)p_Var14)) {
  case 1:
    if (*(int *)(&this->field_0xd0 + (long)p_Var14) == 3) {
      Cast::forward((Cast *)((long)&this->_vptr_Cast_x86 + (long)p_Var14),bottom_blob,top_blob,opt);
    }
    sVar24 = sVar24 * 4;
    break;
  case 2:
  case 4:
    sVar24 = (size_t)(_elempack * 2);
    break;
  case 3:
    break;
  default:
    sVar24 = bottom_blob->elemsize;
  }
  switch(iVar11) {
  case 1:
    Mat::create(top_blob,iVar2,sVar24,_elempack,opt->blob_allocator);
    break;
  case 2:
    Mat::create(top_blob,iVar2,iVar23,sVar24,_elempack,opt->blob_allocator);
    break;
  case 3:
    Mat::create(top_blob,iVar2,iVar23,uVar15,sVar24,_elempack,opt->blob_allocator);
    break;
  case 4:
    Mat::create(top_blob,iVar2,iVar23,iVar3,uVar15,sVar24,_elempack,opt->blob_allocator);
  }
  if (top_blob->data == (void *)0x0) {
    return -100;
  }
  if ((long)top_blob->c * top_blob->cstep == 0) {
    return -100;
  }
  pp_Var12 = this->_vptr_Cast_x86;
  p_Var14 = pp_Var12[-3];
  iVar11 = *(int *)(&this->field_0xd0 + (long)p_Var14);
  if (iVar11 == 1) {
    iVar11 = 1;
    if ((*(int *)(&this->field_0xd4 + (long)p_Var14) == 2) &&
       (iVar4 = bottom_blob->c, 0 < (long)iVar4)) {
      iVar11 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
      lVar26 = 0;
      do {
        if (0 < iVar11) {
          sVar24 = top_blob->cstep;
          sVar6 = bottom_blob->cstep;
          sVar7 = top_blob->elemsize;
          pvVar13 = top_blob->data;
          sVar8 = bottom_blob->elemsize;
          pvVar18 = bottom_blob->data;
          lVar17 = 0;
          do {
            uVar10 = float32_to_float16(*(float *)((long)pvVar18 +
                                                  lVar17 * 4 + sVar6 * sVar8 * lVar26));
            *(unsigned_short *)((long)pvVar13 + lVar17 * 2 + sVar24 * sVar7 * lVar26) = uVar10;
            lVar17 = lVar17 + 1;
          } while (iVar11 != (int)lVar17);
        }
        lVar26 = lVar26 + 1;
      } while (lVar26 != iVar4);
      pp_Var12 = this->_vptr_Cast_x86;
      p_Var14 = pp_Var12[-3];
      iVar11 = *(int *)(&this->field_0xd0 + (long)p_Var14);
      goto LAB_00499899;
    }
LAB_00499a05:
    pp_Var12 = pp_Var12 + -3;
  }
  else {
LAB_00499899:
    if (iVar11 == 2) {
      iVar11 = 2;
      if ((*(int *)(&this->field_0xd4 + (long)p_Var14) != 1) ||
         (iVar4 = bottom_blob->c, (long)iVar4 < 1)) goto LAB_00499a05;
      iVar11 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
      lVar26 = 0;
      do {
        if (0 < iVar11) {
          sVar24 = top_blob->cstep;
          sVar6 = bottom_blob->cstep;
          sVar7 = top_blob->elemsize;
          pvVar13 = top_blob->data;
          sVar8 = bottom_blob->elemsize;
          pvVar18 = bottom_blob->data;
          lVar17 = 0;
          do {
            fVar27 = float16_to_float32(*(unsigned_short *)
                                         ((long)pvVar18 + lVar17 * 2 + sVar6 * sVar8 * lVar26));
            *(float *)((long)pvVar13 + lVar17 * 4 + sVar24 * sVar7 * lVar26) = fVar27;
            lVar17 = lVar17 + 1;
          } while (iVar11 != (int)lVar17);
        }
        lVar26 = lVar26 + 1;
      } while (lVar26 != iVar4);
      pp_Var12 = this->_vptr_Cast_x86;
      p_Var14 = pp_Var12[-3];
      iVar11 = *(int *)(&this->field_0xd0 + (long)p_Var14);
    }
    pp_Var12 = pp_Var12 + -3;
    if (iVar11 == 3) {
      if ((int)uVar15 < 1 || *(int *)(&this->field_0xd4 + (long)p_Var14) != 1) {
        return 0;
      }
      uVar16 = iVar3 * _elempack * iVar23 * iVar2;
      pvVar13 = bottom_blob->data;
      sVar24 = bottom_blob->cstep;
      pvVar18 = top_blob->data;
      sVar6 = top_blob->cstep;
      sVar7 = top_blob->elemsize;
      sVar8 = bottom_blob->elemsize;
      uVar21 = 0;
      do {
        if (0 < (int)uVar16) {
          uVar25 = 0;
          do {
            *(float *)((long)pvVar18 + uVar25 * 4) = (float)(int)*(char *)((long)pvVar13 + uVar25);
            uVar25 = uVar25 + 1;
          } while (uVar16 != uVar25);
        }
        uVar21 = uVar21 + 1;
        pvVar18 = (void *)((long)pvVar18 + sVar6 * sVar7);
        pvVar13 = (void *)((long)pvVar13 + sVar24 * sVar8);
      } while (uVar21 != uVar15);
      p_Var14 = *pp_Var12;
      iVar11 = *(int *)(&this->field_0xd0 + (long)p_Var14);
    }
  }
  if (iVar11 == 1) {
    if (*(int *)(&this->field_0xd4 + (long)p_Var14) != 4) {
      return 0;
    }
    iVar2 = bottom_blob->c;
    if ((long)iVar2 < 1) {
      return 0;
    }
    uVar15 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
    lVar26 = 0;
    do {
      pauVar20 = (undefined1 (*) [16])
                 (bottom_blob->cstep * lVar26 * bottom_blob->elemsize + (long)bottom_blob->data);
      puVar22 = (undefined4 *)(top_blob->cstep * lVar26 * top_blob->elemsize + (long)top_blob->data)
      ;
      if ((int)uVar15 < 8) {
        uVar16 = 0;
      }
      else {
        iVar23 = 7;
        do {
          auVar28 = pshuflw(*pauVar20,*pauVar20,0xed);
          auVar28 = pshufhw(auVar28,auVar28,0xed);
          auVar29 = pshuflw(pauVar20[1],pauVar20[1],0xed);
          auVar29 = pshufhw(auVar29,auVar29,0xed);
          *puVar22 = auVar28._0_4_;
          puVar22[1] = auVar28._8_4_;
          puVar22[2] = auVar29._0_4_;
          puVar22[3] = auVar29._8_4_;
          pauVar20 = pauVar20 + 2;
          puVar22 = puVar22 + 4;
          iVar23 = iVar23 + 8;
          uVar16 = uVar15 & 0xfffffff8;
        } while (iVar23 < (int)uVar15);
      }
      if (uVar15 - uVar16 != 0 && (int)uVar16 <= (int)uVar15) {
        lVar17 = 0;
        do {
          *(undefined2 *)((long)puVar22 + lVar17 * 2) = *(undefined2 *)(*pauVar20 + lVar17 * 4 + 2);
          lVar17 = lVar17 + 1;
        } while (uVar15 - uVar16 != (int)lVar17);
      }
      lVar26 = lVar26 + 1;
    } while (lVar26 != iVar2);
    p_Var14 = *pp_Var12;
    iVar11 = *(int *)(&this->field_0xd0 + (long)p_Var14);
  }
  if (((iVar11 == 4) && (*(int *)(&this->field_0xd4 + (long)p_Var14) == 1)) &&
     (iVar2 = bottom_blob->c, 0 < (long)iVar2)) {
    uVar15 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
    lVar26 = 0;
    do {
      puVar19 = (undefined8 *)
                (bottom_blob->cstep * lVar26 * bottom_blob->elemsize + (long)bottom_blob->data);
      pauVar20 = (undefined1 (*) [16])
                 (top_blob->cstep * lVar26 * top_blob->elemsize + (long)top_blob->data);
      if ((int)uVar15 < 4) {
        uVar16 = 0;
      }
      else {
        iVar23 = 3;
        do {
          uVar1 = *puVar19;
          auVar9._10_2_ = (short)((ulong)uVar1 >> 0x20);
          auVar9._0_10_ = (unkuint10)0;
          auVar28._2_12_ =
               SUB1612(ZEXT616(CONCAT42(auVar9._8_4_,(short)((ulong)uVar1 >> 0x10))) << 0x30,4);
          auVar28._0_2_ = (short)uVar1;
          auVar28._14_2_ = 0;
          *pauVar20 = auVar28 << 0x10;
          puVar19 = puVar19 + 1;
          pauVar20 = pauVar20 + 1;
          iVar23 = iVar23 + 4;
          uVar16 = uVar15 & 0xfffffffc;
        } while (iVar23 < (int)uVar15);
      }
      if (uVar15 - uVar16 != 0 && (int)uVar16 <= (int)uVar15) {
        lVar17 = 0;
        do {
          *(uint *)((long)*pauVar20 + lVar17 * 4) =
               (uint)*(ushort *)((long)puVar19 + lVar17 * 2) << 0x10;
          lVar17 = lVar17 + 1;
        } while (uVar15 - uVar16 != (int)lVar17);
      }
      lVar26 = lVar26 + 1;
    } while (lVar26 != iVar2);
  }
  return 0;
}

Assistant:

int Cast_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    if (type_from == type_to)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    size_t out_elemsize = elemsize;
    if (type_to == 1)
    {
        if (type_from == 3)
        {
            Cast::forward(bottom_blob, top_blob, opt);
        }

        // float32
        out_elemsize = 4 * elempack;
    }
    else if (type_to == 2)
    {
        // float16
        out_elemsize = 2 * elempack;
    }
    else if (type_to == 3)
    {
        // int8
        out_elemsize = elempack;
    }
    else if (type_to == 4)
    {
        // bfloat16
        out_elemsize = 2 * elempack;
    }

    if (dims == 1)
    {
        top_blob.create(w, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 2)
    {
        top_blob.create(w, h, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 3)
    {
        top_blob.create(w, h, channels, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 4)
    {
        top_blob.create(w, h, d, channels, out_elemsize, elempack, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    int size = w * h * d * elempack;

    if (type_from == 1 && type_to == 2)
    {
        cast_fp32_to_fp16_sse(bottom_blob, top_blob, opt);
    }

    if (type_from == 2 && type_to == 1)
    {
        cast_fp16_to_fp32_sse(bottom_blob, top_blob, opt);
    }

    if (type_from == 3 && type_to == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const signed char* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                outptr[i] = (float)ptr[i];
            }
        }
    }

    if (type_from == 1 && type_to == 4)
    {
        cast_fp32_to_bf16_sse(bottom_blob, top_blob, opt);
    }

    if (type_from == 4 && type_to == 1)
    {
        cast_bf16_to_fp32_sse(bottom_blob, top_blob, opt);
    }

    return 0;
}